

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O2

void writeUData(XMLCh *s)

{
  uint uVar1;
  XMLSize_t XVar2;
  
  puts("<udata>");
  XVar2 = xercesc_4_0::XMLString::stringLen(s);
  for (uVar1 = 0; uVar1 < XVar2; uVar1 = uVar1 + 1) {
    if ((uVar1 & 0xf) == 0) {
      putchar(10);
    }
    printf("%4x ",(ulong)(ushort)s[uVar1]);
  }
  puts("\n</udata>");
  return;
}

Assistant:

static void writeUData(const XMLCh* s)
{
    unsigned int i;
    printf("<udata>\n");
    size_t len = XMLString::stringLen(s);
    for (i=0; i<len; i++)
    {
        if (i % 16 == 0)
            printf("\n");
        XMLCh c = s[i];
        printf("%4x ", c);
    }
    printf("\n</udata>\n");
}